

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O1

DescriptorScriptData * __thiscall
cfd::AddressFactory::ParseOutputDescriptor
          (DescriptorScriptData *__return_storage_ptr__,AddressFactory *this,string *descriptor,
          string *bip32_derivation_path,
          vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *script_list
          ,vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>
           *multisig_key_list,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  pointer pDVar1;
  pointer pDVar2;
  pointer pDVar3;
  bool bVar4;
  bool bVar5;
  uint32_t uVar6;
  AddressType AVar7;
  DescriptorScriptType DVar8;
  DescriptorKeyType DVar9;
  DescriptorKeyReference *key_ref_00;
  DescriptorKeyReference *key_ref_01;
  DescriptorKeyReference *key_ref_02;
  DescriptorKeyReference *key_ref_03;
  DescriptorKeyReference *key_ref_04;
  KeyData *key;
  undefined1 __x [8];
  pointer this_00;
  uint32_t index;
  uint uVar10;
  undefined1 auVar11 [8];
  pointer this_01;
  pointer this_02;
  DescriptorScriptData *result;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  script_refs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> temp_list;
  DescriptorScriptReference child;
  DescriptorKeyReference key_ref;
  Descriptor desc;
  DescriptorScriptData data;
  DescriptorNode node;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  local_1360;
  pointer local_1348;
  AddressFactory *local_1340;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_1338;
  pointer local_1318;
  Script *local_1310;
  string *local_1308;
  string *local_1300;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_12f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_12d8;
  undefined1 local_12b8 [8];
  undefined1 auStack_12b0 [8];
  undefined1 local_12a8 [16];
  undefined1 local_1298 [56];
  _Alloc_hider local_1260;
  pointer local_1258;
  TapBranch local_1240;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_11c8;
  Script local_11b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1170 [2];
  uint8_t local_10f8 [4];
  Script local_10f0;
  DescriptorKeyType local_10b8;
  string local_10b0 [328];
  undefined1 local_f68 [16];
  undefined1 local_f58 [32];
  pointer local_f38;
  _func_int **local_f20;
  pointer local_f08;
  TapBranch local_ef0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_e78;
  Script local_e60;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e20 [10];
  DescriptorKeyReference *local_c18;
  DescriptorKeyReference *pDStack_c10;
  pointer local_c08 [2];
  undefined1 local_bf8 [88];
  TapBranch local_ba0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b28;
  Script local_b10;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ad0 [10];
  DescriptorKeyReference local_8c8;
  DescriptorNode local_638;
  undefined1 local_4d0 [552];
  uint32_t local_2a8;
  DescriptorNode local_198;
  
  local_1340 = this;
  if (script_list !=
      (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0) {
    pDVar1 = (script_list->
             super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pDVar2 = (script_list->
             super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    this_01 = pDVar1;
    if (pDVar2 != pDVar1) {
      do {
        DescriptorScriptData::~DescriptorScriptData(this_01);
        this_01 = this_01 + 1;
      } while (this_01 != pDVar2);
      (script_list->
      super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>).
      _M_impl.super__Vector_impl_data._M_finish = pDVar1;
    }
  }
  if (multisig_key_list !=
      (vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x0) {
    std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::clear
              (multisig_key_list);
  }
  DescriptorScriptData::DescriptorScriptData(__return_storage_ptr__);
  __return_storage_ptr__->key_type = kDescriptorKeyNull;
  __return_storage_ptr__->address_type = kP2shAddress;
  __return_storage_ptr__->multisig_req_sig_num = 0;
  core::Descriptor::Parse((Descriptor *)&local_638,descriptor,&local_1340->prefix_list_);
  local_12d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_12d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar10 = 0; uVar6 = core::Descriptor::GetNeedArgumentNum((Descriptor *)&local_638),
      uVar10 < uVar6; uVar10 = uVar10 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_12d8,bip32_derivation_path);
  }
  if (key_list != (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0) {
    core::Descriptor::GetKeyDataAll
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_12b8,
               (Descriptor *)&local_638,&local_12d8);
    auVar11 = auStack_12b0;
    for (__x = local_12b8; __x != auVar11;
        __x = (undefined1  [8])&(((DescriptorKeyReference *)__x)->key_data_).privkey_.is_compressed_
        ) {
      std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::push_back
                (key_list,(value_type *)__x);
    }
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_12b8);
  }
  core::Descriptor::GetReferenceAll(&local_1360,(Descriptor *)&local_638,&local_12d8);
  core::Descriptor::GetNode(&local_198,(Descriptor *)&local_638);
  __return_storage_ptr__->type = local_198.script_type_;
  __return_storage_ptr__->key_type = kDescriptorKeyNull;
  __return_storage_ptr__->depth = 0;
  core::DescriptorScriptReference::GetLockingScript
            ((Script *)local_12b8,
             local_1360.
             super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ._M_impl.super__Vector_impl_data._M_start);
  core::Script::operator=(&__return_storage_ptr__->locking_script,(Script *)local_12b8);
  core::Script::~Script((Script *)local_12b8);
  bVar4 = core::DescriptorScriptReference::HasAddress
                    (local_1360.
                     super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  if (bVar4) {
    core::DescriptorScriptReference::GenerateAddress
              ((Address *)local_12b8,
               local_1360.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start,local_1340->type_);
    core::Address::operator=(&__return_storage_ptr__->address,(Address *)local_12b8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(local_1170);
    core::Script::~Script(&local_11b0);
    local_1240._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_11c8);
    core::TapBranch::~TapBranch(&local_1240);
    if (local_1258 != (pointer)0x0) {
      operator_delete(local_1258);
    }
    if ((_func_int **)local_1298._40_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_1298._40_8_);
    }
    if ((pointer)local_1298._16_8_ != (pointer)0x0) {
      operator_delete((void *)local_1298._16_8_);
    }
    if ((pointer)local_12a8._0_8_ != (pointer)local_1298) {
      operator_delete((void *)local_12a8._0_8_);
    }
    AVar7 = core::DescriptorScriptReference::GetAddressType
                      (local_1360.
                       super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    __return_storage_ptr__->address_type = AVar7;
  }
  bVar4 = core::DescriptorScriptReference::HasRedeemScript
                    (local_1360.
                     super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  if (bVar4) {
    core::DescriptorScriptReference::GetRedeemScript
              ((Script *)local_12b8,
               local_1360.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    core::Script::operator=(&__return_storage_ptr__->redeem_script,(Script *)local_12b8);
    core::Script::~Script((Script *)local_12b8);
  }
  local_1338.
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_start = (DescriptorKeyReference *)0x0;
  local_1338.
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_finish = (DescriptorKeyReference *)0x0;
  local_1338.
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  core::DescriptorKeyReference::DescriptorKeyReference(&local_8c8);
  switch(__return_storage_ptr__->type) {
  case kDescriptorScriptSh:
  case kDescriptorScriptWsh:
    core::DescriptorScriptReference::DescriptorScriptReference
              ((DescriptorScriptReference *)local_12b8,
               local_1360.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    bVar4 = core::DescriptorScriptReference::HasChild((DescriptorScriptReference *)local_12b8);
    if (bVar4) {
      core::Script::Script((Script *)local_f68);
    }
    else {
      core::DescriptorScriptReference::GetRedeemScript
                ((Script *)local_f68,(DescriptorScriptReference *)local_12b8);
    }
    local_1310 = &__return_storage_ptr__->redeem_script;
    core::Script::operator=(local_1310,(Script *)local_f68);
    core::Script::~Script((Script *)local_f68);
    if (bVar4) {
      local_1300 = (string *)(local_4d0 + 0x208);
      local_1308 = (string *)&__return_storage_ptr__->key;
      local_1318 = (pointer)&PTR__TaprootScriptTree_00740b18;
      local_1348 = (pointer)((ulong)local_1348 & 0xffffffff00000000);
      uVar6 = 0;
      do {
        core::DescriptorScriptReference::DescriptorScriptReference
                  ((DescriptorScriptReference *)local_f68);
        DescriptorScriptData::DescriptorScriptData((DescriptorScriptData *)local_4d0);
        DVar8 = core::DescriptorScriptReference::GetScriptType
                          ((DescriptorScriptReference *)local_12b8);
        if (DVar8 - kDescriptorScriptSh < 2) {
          bVar5 = core::DescriptorScriptReference::HasChild((DescriptorScriptReference *)local_12b8)
          ;
          if (bVar5) {
            core::DescriptorScriptReference::GetChild
                      ((DescriptorScriptReference *)&local_c18,
                       (DescriptorScriptReference *)local_12b8);
            core::DescriptorScriptReference::operator=
                      ((DescriptorScriptReference *)local_f68,
                       (DescriptorScriptReference *)&local_c18);
            core::DescriptorScriptReference::~DescriptorScriptReference
                      ((DescriptorScriptReference *)&local_c18);
            DVar8 = core::DescriptorScriptReference::GetScriptType
                              ((DescriptorScriptReference *)local_f68);
            if ((DVar8 == kDescriptorScriptMulti) ||
               (DVar8 = core::DescriptorScriptReference::GetScriptType
                                  ((DescriptorScriptReference *)local_f68),
               DVar8 == kDescriptorScriptSortedMulti)) {
              core::DescriptorScriptReference::GetKeyList
                        (&local_12f8,(DescriptorScriptReference *)local_f68);
              local_c08[0] = local_1338.
                             super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pDStack_c10 = local_1338.
                            super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              local_c18 = local_1338.
                          super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              local_1338.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   local_12f8.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_1338.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_12f8.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_1338.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_12f8.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_12f8.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_start = (DescriptorKeyReference *)0x0;
              local_12f8.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_finish = (DescriptorKeyReference *)0x0;
              local_12f8.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                         *)&local_c18);
              std::
              vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ::~vector(&local_12f8);
              uVar6 = core::DescriptorScriptReference::GetReqNum
                                ((DescriptorScriptReference *)local_f68);
              __return_storage_ptr__->multisig_req_sig_num = uVar6;
              bVar4 = false;
            }
            else {
              DVar8 = core::DescriptorScriptReference::GetScriptType
                                ((DescriptorScriptReference *)local_f68);
              if (DVar8 == kDescriptorScriptMiniscript) {
                bVar4 = false;
              }
            }
            DVar8 = core::DescriptorScriptReference::GetScriptType
                              ((DescriptorScriptReference *)local_f68);
            if (DVar8 == kDescriptorScriptWpkh) goto LAB_003b77bd;
            core::DescriptorScriptReference::GetRedeemScript
                      ((Script *)&local_c18,(DescriptorScriptReference *)local_12b8);
            core::Script::operator=(local_1310,(Script *)&local_c18);
          }
          else {
            core::DescriptorScriptReference::GetRedeemScript
                      ((Script *)&local_c18,(DescriptorScriptReference *)local_12b8);
            core::Script::operator=(local_1310,(Script *)&local_c18);
          }
          core::Script::~Script((Script *)&local_c18);
        }
        else {
          bVar4 = false;
        }
LAB_003b77bd:
        local_4d0._0_4_ =
             core::DescriptorScriptReference::GetScriptType((DescriptorScriptReference *)local_12b8)
        ;
        local_4d0._64_4_ = (uint32_t)local_1348;
        core::DescriptorScriptReference::GetLockingScript
                  ((Script *)&local_c18,(DescriptorScriptReference *)local_12b8);
        core::Script::operator=((Script *)(local_4d0 + 8),(Script *)&local_c18);
        core::Script::~Script((Script *)&local_c18);
        core::DescriptorScriptReference::GenerateAddress
                  ((Address *)&local_c18,(DescriptorScriptReference *)local_12b8,local_1340->type_);
        core::Address::operator=((Address *)(local_4d0 + 0x48),(Address *)&local_c18);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(local_ad0);
        core::Script::~Script(&local_b10);
        local_ba0._vptr_TapBranch = (_func_int **)local_1318;
        std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (&local_b28);
        core::TapBranch::~TapBranch(&local_ba0);
        if ((pointer)local_bf8._64_8_ != (pointer)0x0) {
          operator_delete((void *)local_bf8._64_8_);
        }
        if ((_func_int **)local_bf8._40_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_bf8._40_8_);
        }
        if ((pointer)local_bf8._16_8_ != (pointer)0x0) {
          operator_delete((void *)local_bf8._16_8_);
        }
        if (local_c08[0] != (pointer)local_bf8) {
          operator_delete(local_c08[0]);
        }
        local_4d0._448_4_ =
             core::DescriptorScriptReference::GetAddressType
                       ((DescriptorScriptReference *)local_12b8);
        bVar5 = core::DescriptorScriptReference::HasRedeemScript
                          ((DescriptorScriptReference *)local_12b8);
        if (bVar5) {
          core::DescriptorScriptReference::GetRedeemScript
                    ((Script *)&local_c18,(DescriptorScriptReference *)local_12b8);
          core::Script::operator=((Script *)(local_4d0 + 0x1c8),(Script *)&local_c18);
          core::Script::~Script((Script *)&local_c18);
        }
        bVar5 = core::DescriptorScriptReference::HasKey((DescriptorScriptReference *)local_12b8);
        if (bVar5) {
          core::DescriptorScriptReference::GetKeyList
                    ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                      *)&local_c18,(DescriptorScriptReference *)local_12b8);
          core::DescriptorKeyReference::operator=(&local_8c8,local_c18);
          std::
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                     *)&local_c18);
          local_4d0._512_4_ = core::DescriptorKeyReference::GetKeyType(&local_8c8);
          const::$_0::operator()::DescriptorKeyReference_const___const
                    ((string *)&local_c18,&local_8c8,key_ref_02);
          std::__cxx11::string::operator=(local_1300,(string *)&local_c18);
          if (local_c18 != (DescriptorKeyReference *)local_c08) {
            operator_delete(local_c18);
          }
          DVar9 = core::DescriptorKeyReference::GetKeyType(&local_8c8);
          __return_storage_ptr__->key_type = DVar9;
          const::$_0::operator()::DescriptorKeyReference_const___const
                    ((string *)&local_c18,&local_8c8,key_ref_03);
          std::__cxx11::string::operator=(local_1308,(string *)&local_c18);
          if (local_c18 != (DescriptorKeyReference *)local_c08) {
            operator_delete(local_c18);
          }
        }
        else {
          local_4d0._512_4_ = kDescriptorKeyNull;
        }
        local_2a8 = uVar6;
        if (script_list !=
            (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0) {
          std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
          push_back(script_list,(value_type *)local_4d0);
        }
        if ((bVar4 == false) ||
           (bVar5 = core::DescriptorScriptReference::HasChild
                              ((DescriptorScriptReference *)local_12b8), !bVar5)) {
          bVar4 = false;
        }
        else {
          core::DescriptorScriptReference::GetChild
                    ((DescriptorScriptReference *)&local_c18,(DescriptorScriptReference *)local_12b8
                    );
          core::DescriptorScriptReference::operator=
                    ((DescriptorScriptReference *)local_f68,(DescriptorScriptReference *)&local_c18)
          ;
          core::DescriptorScriptReference::~DescriptorScriptReference
                    ((DescriptorScriptReference *)&local_c18);
          core::DescriptorScriptReference::operator=
                    ((DescriptorScriptReference *)local_12b8,(DescriptorScriptReference *)local_f68)
          ;
          local_1348 = (pointer)CONCAT44(local_1348._4_4_,(uint32_t)local_1348 + 1);
        }
        DescriptorScriptData::~DescriptorScriptData((DescriptorScriptData *)local_4d0);
        core::DescriptorScriptReference::~DescriptorScriptReference
                  ((DescriptorScriptReference *)local_f68);
      } while (bVar4 != false);
    }
    core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)local_12b8);
    break;
  case kDescriptorScriptPk:
  case kDescriptorScriptPkh:
  case kDescriptorScriptWpkh:
    core::DescriptorScriptReference::GetKeyList
              ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                *)local_12b8,
               local_1360.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    core::DescriptorKeyReference::operator=(&local_8c8,(DescriptorKeyReference *)local_12b8);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)local_12b8);
    DVar9 = core::DescriptorKeyReference::GetKeyType(&local_8c8);
    __return_storage_ptr__->key_type = DVar9;
    const::$_0::operator()::DescriptorKeyReference_const___const
              ((string *)local_12b8,&local_8c8,key_ref_00);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->key,(string *)local_12b8);
    auVar11 = local_12b8;
    if (local_12b8 == (undefined1  [8])local_12a8) break;
    goto LAB_003b7b8b;
  case kDescriptorScriptCombo:
    if (local_1360.
        super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1360.
        super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_1318 = (pointer)&__return_storage_ptr__->key;
      local_1348 = (pointer)&PTR__TaprootScriptTree_00740b18;
      this_02 = local_1360.
                super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        DescriptorScriptData::DescriptorScriptData((DescriptorScriptData *)local_12b8);
        DVar8 = core::DescriptorScriptReference::GetScriptType(this_02);
        local_12b8._0_4_ = DVar8;
        local_1298._32_4_ = 0;
        core::DescriptorScriptReference::GetLockingScript((Script *)local_f68,this_02);
        core::Script::operator=((Script *)auStack_12b0,(Script *)local_f68);
        core::Script::~Script((Script *)local_f68);
        bVar4 = core::DescriptorScriptReference::HasAddress(this_02);
        if (bVar4) {
          core::DescriptorScriptReference::GenerateAddress
                    ((Address *)local_f68,this_02,local_1340->type_);
          core::Address::operator=((Address *)(local_1298 + 0x28),(Address *)local_f68);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(local_e20);
          core::Script::~Script(&local_e60);
          local_ef0._vptr_TapBranch = (_func_int **)local_1348;
          std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                    (&local_e78);
          core::TapBranch::~TapBranch(&local_ef0);
          if (local_f08 != (pointer)0x0) {
            operator_delete(local_f08);
          }
          if (local_f20 != (_func_int **)0x0) {
            operator_delete(local_f20);
          }
          if (local_f38 != (pointer)0x0) {
            operator_delete(local_f38);
          }
          if ((pointer)local_f58._0_8_ != (pointer)(local_f58 + 0x10)) {
            operator_delete((void *)local_f58._0_8_);
          }
          local_10f8 = (uint8_t  [4])core::DescriptorScriptReference::GetAddressType(this_02);
        }
        else {
          local_10f8[0] = '\x01';
          local_10f8[1] = '\0';
          local_10f8[2] = '\0';
          local_10f8[3] = '\0';
        }
        bVar4 = core::DescriptorScriptReference::HasRedeemScript(this_02);
        if (bVar4) {
          core::DescriptorScriptReference::GetRedeemScript((Script *)local_f68,this_02);
          core::Script::operator=(&local_10f0,(Script *)local_f68);
          core::Script::~Script((Script *)local_f68);
          local_10b8 = kDescriptorKeyNull;
        }
        else {
          core::DescriptorScriptReference::GetKeyList
                    ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                      *)local_f68,this_02);
          core::DescriptorKeyReference::operator=
                    (&local_8c8,(DescriptorKeyReference *)local_f68._0_8_);
          std::
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                     *)local_f68);
          local_10b8 = core::DescriptorKeyReference::GetKeyType(&local_8c8);
          const::$_0::operator()::DescriptorKeyReference_const___const
                    ((string *)local_f68,&local_8c8,key_ref_01);
          std::__cxx11::string::operator=(local_10b0,(string *)local_f68);
          if ((DescriptorKeyReference *)local_f68._0_8_ != (DescriptorKeyReference *)local_f58) {
            operator_delete((void *)local_f68._0_8_);
          }
          if (__return_storage_ptr__->key_type == kDescriptorKeyNull) {
            __return_storage_ptr__->key_type = local_10b8;
            std::__cxx11::string::_M_assign((string *)local_1318);
          }
        }
        if (script_list !=
            (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0) {
          std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
          push_back(script_list,(DescriptorScriptData *)local_12b8);
        }
        DescriptorScriptData::~DescriptorScriptData((DescriptorScriptData *)local_12b8);
        this_02 = this_02 + 1;
      } while (this_02 !=
               local_1360.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    break;
  case kDescriptorScriptMulti:
  case kDescriptorScriptSortedMulti:
    core::DescriptorScriptReference::GetKeyList
              ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                *)local_f68,
               local_1360.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_12a8._0_8_ =
         local_1338.
         super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    auStack_12b0 = (undefined1  [8])
                   local_1338.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    local_12b8 = (undefined1  [8])
                 local_1338.
                 super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    local_1338.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_f68._0_8_;
    local_1338.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_f68._8_8_;
    local_1338.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_f58._0_8_;
    local_f68._0_8_ = (DescriptorKeyReference *)0x0;
    local_f68._8_8_ = (DescriptorKeyReference *)0x0;
    local_f58._0_8_ = (pointer)0x0;
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)local_12b8);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)local_f68);
    uVar6 = core::DescriptorScriptReference::GetReqNum
                      (local_1360.
                       super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    __return_storage_ptr__->multisig_req_sig_num = uVar6;
    break;
  case kDescriptorScriptTaproot:
    core::DescriptorScriptReference::GetKeyList
              ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                *)local_12b8,
               local_1360.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    core::DescriptorKeyReference::operator=(&local_8c8,(DescriptorKeyReference *)local_12b8);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)local_12b8);
    core::DescriptorScriptReference::GetTapBranch
              ((TapBranch *)local_12b8,
               local_1360.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    core::TapBranch::operator=(&__return_storage_ptr__->branch,(TapBranch *)local_12b8);
    core::TapBranch::~TapBranch((TapBranch *)local_12b8);
    core::DescriptorScriptReference::GetScriptTree
              ((TaprootScriptTree *)local_12b8,
               local_1360.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    core::TaprootScriptTree::operator=
              (&__return_storage_ptr__->tree,(TaprootScriptTree *)local_12b8);
    local_12b8 = (undefined1  [8])&PTR__TaprootScriptTree_00740b18;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               &local_1240);
    core::TapBranch::~TapBranch((TapBranch *)local_12b8);
    DVar9 = core::DescriptorKeyReference::GetKeyType(&local_8c8);
    __return_storage_ptr__->key_type = DVar9;
    bVar4 = core::DescriptorKeyReference::HasExtPrivkey(&local_8c8);
    if (bVar4) {
      core::DescriptorKeyReference::GetExtPrivkey((ExtPrivkey *)local_12b8,&local_8c8);
      core::ExtPrivkey::ToString_abi_cxx11_((string *)local_f68,(ExtPrivkey *)local_12b8);
      std::__cxx11::string::operator=((string *)&__return_storage_ptr__->key,(string *)local_f68);
      local_1260._M_p = (pointer)local_1258;
      if ((DescriptorKeyReference *)local_f68._0_8_ != (DescriptorKeyReference *)local_f58) {
        operator_delete((void *)local_f68._0_8_);
        local_1260._M_p = (pointer)local_1258;
      }
LAB_003b7ade:
      if ((pointer)local_1260._M_p != (pointer)0x0) {
        operator_delete(local_1260._M_p);
      }
      if ((void *)CONCAT44(local_1298._36_4_,local_1298._32_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_1298._36_4_,local_1298._32_4_));
      }
      auVar11 = local_12b8;
      if ((pointer)local_1298._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_1298._8_8_);
        auVar11 = local_12b8;
      }
    }
    else {
      bVar4 = core::DescriptorKeyReference::HasExtPubkey(&local_8c8);
      if (bVar4) {
        core::DescriptorKeyReference::GetExtPubkey((ExtPubkey *)local_12b8,&local_8c8);
        core::ExtPubkey::ToString_abi_cxx11_((string *)local_f68,(ExtPubkey *)local_12b8);
        std::__cxx11::string::operator=((string *)&__return_storage_ptr__->key,(string *)local_f68);
        if ((DescriptorKeyReference *)local_f68._0_8_ != (DescriptorKeyReference *)local_f58) {
          operator_delete((void *)local_f68._0_8_);
        }
        goto LAB_003b7ade;
      }
      __return_storage_ptr__->key_type = kDescriptorKeySchnorr;
      core::DescriptorKeyReference::GetSchnorrPubkey((SchnorrPubkey *)local_f68,&local_8c8);
      core::SchnorrPubkey::GetHex_abi_cxx11_((string *)local_12b8,(SchnorrPubkey *)local_f68);
      std::__cxx11::string::operator=((string *)&__return_storage_ptr__->key,(string *)local_12b8);
      auVar11 = (undefined1  [8])local_f68._0_8_;
      if (local_12b8 != (undefined1  [8])local_12a8) {
        operator_delete((void *)local_12b8);
        auVar11 = (undefined1  [8])local_f68._0_8_;
      }
    }
    if (auVar11 == (undefined1  [8])0x0) break;
LAB_003b7b8b:
    operator_delete((void *)auVar11);
  }
  pDVar3 = local_1338.
           super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1338.
      super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1338.
      super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ._M_impl.super__Vector_impl_data._M_finish &&
      multisig_key_list !=
      (vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x0) {
    this_00 = local_1338.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      DVar9 = core::DescriptorKeyReference::GetKeyType(this_00);
      local_12b8._0_4_ = DVar9;
      const::$_0::operator()::DescriptorKeyReference_const___const
                ((string *)auStack_12b0,this_00,key_ref_04);
      std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::push_back
                (multisig_key_list,(value_type *)local_12b8);
      if (auStack_12b0 != (undefined1  [8])(local_12a8 + 8)) {
        operator_delete((void *)auStack_12b0);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pDVar3);
  }
  core::DescriptorKeyReference::~DescriptorKeyReference(&local_8c8);
  std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ::~vector(&local_1338);
  core::DescriptorNode::~DescriptorNode(&local_198);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::~vector(&local_1360);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_12d8);
  core::DescriptorNode::~DescriptorNode(&local_638);
  return __return_storage_ptr__;
}

Assistant:

DescriptorScriptData AddressFactory::ParseOutputDescriptor(
    const std::string& descriptor, const std::string& bip32_derivation_path,
    std::vector<DescriptorScriptData>* script_list,
    std::vector<DescriptorKeyData>* multisig_key_list,
    std::vector<KeyData>* key_list) const {
  if (script_list != nullptr) script_list->clear();
  if (multisig_key_list != nullptr) multisig_key_list->clear();

  static auto get_keystr_function =
      [](const DescriptorKeyReference& key_ref) -> std::string {
    if (key_ref.HasExtPrivkey()) {
      return key_ref.GetExtPrivkey().ToString();
    } else if (key_ref.HasExtPubkey()) {
      return key_ref.GetExtPubkey().ToString();
    } else {
      return key_ref.GetPubkey().GetHex();
    }
  };

  DescriptorScriptData result;
  result.key_type = DescriptorKeyType::kDescriptorKeyNull;  // dummy init
  result.address_type = AddressType::kP2shAddress;          // dummy init
  result.multisig_req_sig_num = 0;
  Descriptor desc = Descriptor::Parse(descriptor, &prefix_list_);
  std::vector<std::string> args;
  for (uint32_t index = 0; index < desc.GetNeedArgumentNum(); ++index) {
    args.push_back(bip32_derivation_path);
  }
  if (key_list != nullptr) {
    auto temp_list = desc.GetKeyDataAll(&args);
    for (const auto& key : temp_list) {
      key_list->push_back(key);
    }
  }
  std::vector<DescriptorScriptReference> script_refs =
      desc.GetReferenceAll(&args);
  DescriptorNode node = desc.GetNode();

  result.type = node.GetScriptType();
  result.key_type = DescriptorKeyType::kDescriptorKeyNull;
  result.depth = 0;
  result.locking_script = script_refs[0].GetLockingScript();
  if (script_refs[0].HasAddress()) {
    result.address = script_refs[0].GenerateAddress(type_);
    result.address_type = script_refs[0].GetAddressType();
  }
  if (script_refs[0].HasRedeemScript()) {
    result.redeem_script = script_refs[0].GetRedeemScript();
  }

  std::vector<DescriptorKeyReference> multisig_keys;
  uint32_t multisig_req_num = 0;
  bool use_script_list = false;
  DescriptorKeyReference key_ref;
  switch (result.type) {
    case DescriptorScriptType::kDescriptorScriptCombo:
      for (const auto& ref : script_refs) {
        DescriptorScriptData ref_data;
        ref_data.type = ref.GetScriptType();
        ref_data.depth = 0;
        ref_data.locking_script = ref.GetLockingScript();
        if (ref.HasAddress()) {
          ref_data.address = ref.GenerateAddress(type_);
          ref_data.address_type = ref.GetAddressType();
        } else {
          ref_data.address_type = AddressType::kP2shAddress;  // dummy init
        }
        if (ref.HasRedeemScript()) {
          ref_data.redeem_script = ref.GetRedeemScript();
          ref_data.key_type = DescriptorKeyType::kDescriptorKeyNull;
        } else {
          key_ref = ref.GetKeyList()[0];
          ref_data.key_type = key_ref.GetKeyType();
          ref_data.key = get_keystr_function(key_ref);
          if (result.key_type == DescriptorKeyType::kDescriptorKeyNull) {
            result.key_type = ref_data.key_type;
            result.key = ref_data.key;
          }
        }
        if (script_list != nullptr) script_list->push_back(ref_data);
      }
      break;
    case DescriptorScriptType::kDescriptorScriptSh:
    case DescriptorScriptType::kDescriptorScriptWsh:
      use_script_list = true;
      break;
    case DescriptorScriptType::kDescriptorScriptPk:
    case DescriptorScriptType::kDescriptorScriptPkh:
    case DescriptorScriptType::kDescriptorScriptWpkh:
      key_ref = script_refs[0].GetKeyList()[0];
      result.key_type = key_ref.GetKeyType();
      result.key = get_keystr_function(key_ref);
      break;
    case DescriptorScriptType::kDescriptorScriptMulti:
    case DescriptorScriptType::kDescriptorScriptSortedMulti:
      multisig_keys = script_refs[0].GetKeyList();
      result.multisig_req_sig_num = script_refs[0].GetReqNum();
      break;
    case DescriptorScriptType::kDescriptorScriptTaproot:
      key_ref = script_refs[0].GetKeyList()[0];
      result.branch = script_refs[0].GetTapBranch();
      result.tree = script_refs[0].GetScriptTree();
      result.key_type = key_ref.GetKeyType();
      if (key_ref.HasExtPrivkey()) {
        result.key = key_ref.GetExtPrivkey().ToString();
      } else if (key_ref.HasExtPubkey()) {
        result.key = key_ref.GetExtPubkey().ToString();
      } else {
        result.key_type = DescriptorKeyType::kDescriptorKeySchnorr;
        result.key = key_ref.GetSchnorrPubkey().GetHex();
      }
      break;
    case DescriptorScriptType::kDescriptorScriptRaw:
    case DescriptorScriptType::kDescriptorScriptAddr:
    default:
      break;
  }

  if (use_script_list) {
    DescriptorScriptReference script_ref = script_refs[0];
    bool is_loop = script_ref.HasChild();
    uint32_t depth = 0;
    result.redeem_script = (is_loop) ? Script() : script_ref.GetRedeemScript();
    while (is_loop) {
      DescriptorScriptReference child;
      DescriptorScriptData data;
      switch (script_ref.GetScriptType()) {
        case DescriptorScriptType::kDescriptorScriptSh:
        case DescriptorScriptType::kDescriptorScriptWsh:
          if (!script_ref.HasChild()) {
            result.redeem_script = script_ref.GetRedeemScript();
          } else {
            child = script_ref.GetChild();
            if ((child.GetScriptType() ==
                 DescriptorScriptType::kDescriptorScriptMulti) ||
                (child.GetScriptType() ==
                 DescriptorScriptType::kDescriptorScriptSortedMulti)) {
              multisig_keys = child.GetKeyList();
              multisig_req_num = child.GetReqNum();
              result.multisig_req_sig_num = multisig_req_num;
              is_loop = false;
            } else if (
                child.GetScriptType() ==
                DescriptorScriptType::kDescriptorScriptMiniscript) {
              is_loop = false;
            }
            if (child.GetScriptType() !=
                DescriptorScriptType::kDescriptorScriptWpkh) {
              result.redeem_script = script_ref.GetRedeemScript();
            }
          }
          break;
        // case DescriptorScriptType::kDescriptorScriptPk:
        // case DescriptorScriptType::kDescriptorScriptPkh:
        // case DescriptorScriptType::kDescriptorScriptWpkh:
        default:
          is_loop = false;
          break;
      }
      data.type = script_ref.GetScriptType();
      data.depth = depth;
      data.locking_script = script_ref.GetLockingScript();
      data.address = script_ref.GenerateAddress(type_);
      data.address_type = script_ref.GetAddressType();
      if (script_ref.HasRedeemScript()) {
        data.redeem_script = script_ref.GetRedeemScript();
      }
      if (script_ref.HasKey()) {
        key_ref = script_ref.GetKeyList()[0];
        data.key_type = key_ref.GetKeyType();
        data.key = get_keystr_function(key_ref);
        result.key_type = key_ref.GetKeyType();
        result.key = get_keystr_function(key_ref);
      } else {
        data.key_type = DescriptorKeyType::kDescriptorKeyNull;
      }
      data.multisig_req_sig_num = multisig_req_num;

      if (script_list != nullptr) script_list->push_back(data);
      if (is_loop && script_ref.HasChild()) {
        child = script_ref.GetChild();
        script_ref = child;
        ++depth;
      } else {
        is_loop = false;
      }
    }
  }

  if ((!multisig_keys.empty()) && multisig_key_list) {
    for (const auto& ref : multisig_keys) {
      DescriptorKeyData key_data{ref.GetKeyType(), get_keystr_function(ref)};
      multisig_key_list->push_back(key_data);
    }
  }
  return result;
}